

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<unsigned_long,_16UL>::reserve
          (ArrayWithPreallocation<unsigned_long,_16UL> *this,size_t minSize)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar1 < minSize) {
    uVar6 = minSize + 0xf & 0xfffffffffffffff0;
    if (0x10 < uVar6) {
      pvVar4 = operator_new__(uVar6 * 8);
      lVar2 = *(long *)(this + 8);
      if (lVar2 != 0) {
        lVar3 = *(long *)this;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)pvVar4 + lVar5 * 8) = *(undefined8 *)(lVar3 + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar2 != lVar5);
      }
      if ((0x10 < uVar1) && (*(void **)this != (void *)0x0)) {
        operator_delete__(*(void **)this);
      }
      *(void **)this = pvVar4;
    }
    *(ulong *)(this + 0x10) = uVar6;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }